

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_ImplicationExprPrecedence_Test::TestBody
          (ExprWriterTest_ImplicationExprPrecedence_Test *this)

{
  LogicalConstant other;
  LogicalConstant other_00;
  LogicalConstant other_01;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_02;
  LogicalConstant other_03;
  LogicalConstant other_04;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_05;
  NumericConstant other_06;
  NumericConstant other_07;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_08;
  LogicalConstant other_09;
  LogicalConstant other_10;
  LogicalConstant other_11;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_12;
  LogicalConstant other_13;
  LogicalConstant other_14;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_15;
  NumericConstant other_16;
  NumericConstant other_17;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_18;
  LogicalConstant other_19;
  LogicalConstant other_20;
  LogicalConstant other_21;
  LogicalConstant other_22;
  LogicalConstant other_23;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_24;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_25;
  NumericConstant other_26;
  NumericConstant other_27;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_28;
  LogicalConstant other_29;
  LogicalConstant other_30;
  LogicalConstant other_31;
  LogicalConstant other_32;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_33;
  LogicalConstant other_34;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_35;
  NumericConstant other_36;
  NumericConstant other_37;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_38;
  LogicalConstant other_39;
  LogicalConstant other_40;
  LogicalConstant other_41;
  LogicalConstant other_42;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_43;
  LogicalConstant other_44;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_45;
  NumericConstant other_46;
  NumericConstant other_47;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_48;
  LogicalConstant other_49;
  LogicalConstant other_50;
  LogicalConstant other_51;
  LogicalExpr rhs;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  other_52;
  LogicalConstant other_53;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_54;
  NumericConstant other_55;
  NumericConstant other_56;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_57;
  LogicalConstant other_58;
  LogicalConstant other_59;
  LogicalConstant other_60;
  LogicalExpr rhs_00;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  other_61;
  LogicalConstant other_62;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)65> other_63;
  NumericConstant other_64;
  NumericConstant other_65;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> other_66;
  bool bVar1;
  undefined1 uVar2;
  CStringRef arg0;
  BasicExprFactory<std::allocator<char>_> *this_00;
  long in_RDI;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  NumericConstant n1;
  NumericConstant n0;
  ExprWriterTest *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  Kind in_stack_fffffffffffff854;
  undefined4 uVar3;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffff858;
  uint in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  undefined4 uVar4;
  ExprBase in_stack_fffffffffffff868;
  char *expected_expression;
  int line;
  ExprBase in_stack_fffffffffffff870;
  string *file;
  ExprBase in_stack_fffffffffffff878;
  Type type;
  undefined7 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff887;
  CStringRef in_stack_fffffffffffff888;
  Message *in_stack_fffffffffffff8c8;
  Message *message;
  AssertHelper *in_stack_fffffffffffff8d0;
  AssertHelper *this_01;
  char local_5c8 [8];
  BasicCStringRef<char> local_5c0;
  string local_5b8 [32];
  AssertionResult local_598 [2];
  Impl *local_578;
  Impl *local_568;
  undefined8 local_558;
  undefined8 local_548;
  undefined8 local_538;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_528;
  undefined8 local_518;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_508;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_4f8;
  BasicCStringRef<char> local_4e8;
  string local_4e0 [32];
  AssertionResult local_4c0 [2];
  Impl *local_4a0;
  Impl *local_490;
  undefined8 local_480;
  undefined8 local_470;
  undefined8 local_460;
  undefined8 local_450;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_440;
  undefined8 local_430;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_420;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_410;
  Message local_408;
  BasicCStringRef<char> local_400;
  AssertHelper local_3f8 [4];
  AssertionResult local_3d8 [2];
  Impl *local_3b8;
  Impl *local_3a8;
  undefined8 local_398;
  undefined8 local_388;
  undefined8 local_378;
  undefined8 local_368;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_358;
  undefined8 local_348;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_338;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_328;
  BasicCStringRef<char> local_318;
  string local_310 [32];
  AssertionResult local_2f0 [2];
  Impl *local_2d0;
  Impl *local_2c0;
  undefined8 local_2b0;
  undefined8 local_2a0;
  undefined8 local_290;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_280;
  undefined8 local_270;
  undefined8 local_260;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_250;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_240;
  BasicCStringRef<char> local_230;
  string local_228 [32];
  AssertionResult local_208 [2];
  Impl *local_1e8;
  Impl *local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_178;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_168;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_158;
  BasicCStringRef<char> local_148;
  string local_140 [32];
  AssertionResult local_120 [3];
  Impl *local_f0;
  Impl *local_e0;
  undefined8 local_d0;
  undefined8 local_c0;
  undefined8 local_b0;
  undefined8 local_a0;
  undefined8 local_90;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_80;
  BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65> local_70;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_60;
  BasicCStringRef<char> local_50;
  string local_48 [32];
  AssertionResult local_28;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_10;
  
  local_10.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffff848,6.14004527960022e-318);
  local_18.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffff848,6.14018855863751e-318);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"{}");
  local_90 = *(undefined8 *)(in_RDI + 0x48);
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other,
             in_stack_fffffffffffff854);
  local_a0 = *(undefined8 *)(in_RDI + 0x50);
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_00
             ,in_stack_fffffffffffff854);
  local_b0 = *(undefined8 *)(in_RDI + 0x48);
  other_01.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_01.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_01
             ,in_stack_fffffffffffff854);
  local_80.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_02.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_02.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_02
             ,in_stack_fffffffffffff854);
  local_c0 = *(undefined8 *)(in_RDI + 0x48);
  other_03.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_03.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_03
             ,in_stack_fffffffffffff854);
  local_d0 = *(undefined8 *)(in_RDI + 0x48);
  other_04.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_04.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_04
             ,in_stack_fffffffffffff854);
  local_70.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_05.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_05.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_05
             ,in_stack_fffffffffffff854);
  local_e0 = (Impl *)local_18.super_ExprBase.impl_;
  other_06.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_06.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_06,
             in_stack_fffffffffffff854);
  local_f0 = (Impl *)local_10.super_ExprBase.impl_;
  other_07.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_07.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_07,
             in_stack_fffffffffffff854);
  local_60.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (NumericExpr)in_stack_fffffffffffff870.impl_,
                  (NumericExpr)in_stack_fffffffffffff868.impl_);
  other_08.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_08.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_08,
             in_stack_fffffffffffff854);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffff888,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff868.impl_,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (char (*) [24])in_stack_fffffffffffff858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::__cxx11::string::~string(local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
    testing::AssertionResult::failure_message((AssertionResult *)0x12f9dd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
               (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20),
               (char *)in_stack_fffffffffffff870.impl_,
               (int)((ulong)in_stack_fffffffffffff868.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x12fa40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fa98);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_148,"{}");
  local_188 = *(undefined8 *)(in_RDI + 0x48);
  other_09.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_09.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_09
             ,in_stack_fffffffffffff854);
  local_198 = *(undefined8 *)(in_RDI + 0x50);
  other_10.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_10.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_10
             ,in_stack_fffffffffffff854);
  local_1a8 = *(undefined8 *)(in_RDI + 0x48);
  other_11.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_11.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_11
             ,in_stack_fffffffffffff854);
  local_178.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_12.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_12.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_12
             ,in_stack_fffffffffffff854);
  local_1b8 = *(undefined8 *)(in_RDI + 0x48);
  other_13.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_13.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_13
             ,in_stack_fffffffffffff854);
  local_1c8 = *(undefined8 *)(in_RDI + 0x50);
  other_14.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_14.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_14
             ,in_stack_fffffffffffff854);
  local_168.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_15.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_15.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_15
             ,in_stack_fffffffffffff854);
  local_1d8 = (Impl *)local_18.super_ExprBase.impl_;
  other_16.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_16.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_16,
             in_stack_fffffffffffff854);
  local_1e8 = (Impl *)local_10.super_ExprBase.impl_;
  other_17.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_17.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_17,
             in_stack_fffffffffffff854);
  local_158.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (NumericExpr)in_stack_fffffffffffff870.impl_,
                  (NumericExpr)in_stack_fffffffffffff868.impl_);
  other_18.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_18.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_18,
             in_stack_fffffffffffff854);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffff888,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff868.impl_,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (char (*) [31])in_stack_fffffffffffff858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::__cxx11::string::~string(local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
    testing::AssertionResult::failure_message((AssertionResult *)0x12fddb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
               (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20),
               (char *)in_stack_fffffffffffff870.impl_,
               (int)((ulong)in_stack_fffffffffffff868.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x12fe3e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fe96);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_230,"{}");
  local_260 = *(undefined8 *)(in_RDI + 0x48);
  other_19.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_19.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_19
             ,in_stack_fffffffffffff854);
  local_270 = *(undefined8 *)(in_RDI + 0x50);
  other_20.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_20.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_20
             ,in_stack_fffffffffffff854);
  local_290 = *(undefined8 *)(in_RDI + 0x48);
  other_21.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_21.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_21
             ,in_stack_fffffffffffff854);
  local_2a0 = *(undefined8 *)(in_RDI + 0x50);
  other_22.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_22.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_22
             ,in_stack_fffffffffffff854);
  local_2b0 = *(undefined8 *)(in_RDI + 0x48);
  other_23.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_23.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_23
             ,in_stack_fffffffffffff854);
  local_280.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_24.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_24.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_24
             ,in_stack_fffffffffffff854);
  local_250.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_25.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_25.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_25
             ,in_stack_fffffffffffff854);
  local_2c0 = (Impl *)local_18.super_ExprBase.impl_;
  other_26.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_26.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_26,
             in_stack_fffffffffffff854);
  local_2d0 = (Impl *)local_10.super_ExprBase.impl_;
  other_27.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_27.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_27,
             in_stack_fffffffffffff854);
  local_240.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (NumericExpr)in_stack_fffffffffffff870.impl_,
                  (NumericExpr)in_stack_fffffffffffff868.impl_);
  other_28.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_28.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_28,
             in_stack_fffffffffffff854);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffff888,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[31],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff868.impl_,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (char (*) [31])in_stack_fffffffffffff858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::__cxx11::string::~string(local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
    testing::AssertionResult::failure_message((AssertionResult *)0x1301d9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
               (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20),
               (char *)in_stack_fffffffffffff870.impl_,
               (int)((ulong)in_stack_fffffffffffff868.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x13023c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130294);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_318,"{}");
  local_348 = *(undefined8 *)(in_RDI + 0x48);
  other_29.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_29.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_29
             ,in_stack_fffffffffffff854);
  local_368 = *(undefined8 *)(in_RDI + 0x50);
  other_30.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_30.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_30
             ,in_stack_fffffffffffff854);
  local_378 = *(undefined8 *)(in_RDI + 0x48);
  other_31.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_31.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_31
             ,in_stack_fffffffffffff854);
  local_388 = *(undefined8 *)(in_RDI + 0x48);
  other_32.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_32.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_32
             ,in_stack_fffffffffffff854);
  local_358.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_33.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_33.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_33
             ,in_stack_fffffffffffff854);
  local_398 = *(undefined8 *)(in_RDI + 0x50);
  other_34.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_34.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_34
             ,in_stack_fffffffffffff854);
  local_338.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_35.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_35.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_35
             ,in_stack_fffffffffffff854);
  local_3a8 = (Impl *)local_18.super_ExprBase.impl_;
  other_36.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_36.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_36,
             in_stack_fffffffffffff854);
  local_3b8 = (Impl *)local_10.super_ExprBase.impl_;
  other_37.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_37.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_37,
             in_stack_fffffffffffff854);
  local_328.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (NumericExpr)in_stack_fffffffffffff870.impl_,
                  (NumericExpr)in_stack_fffffffffffff868.impl_);
  other_38.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_38.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_38,
             in_stack_fffffffffffff854);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffff888,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[33],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff868.impl_,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (char (*) [33])in_stack_fffffffffffff858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::__cxx11::string::~string(local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
    testing::AssertionResult::failure_message((AssertionResult *)0x1305d7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
               (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20),
               (char *)in_stack_fffffffffffff870.impl_,
               (int)((ulong)in_stack_fffffffffffff868.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x13063a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130692);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_400,"{}");
  local_430 = *(undefined8 *)(in_RDI + 0x48);
  other_39.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_39.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_39
             ,in_stack_fffffffffffff854);
  local_450 = *(undefined8 *)(in_RDI + 0x50);
  other_40.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_40.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_40
             ,in_stack_fffffffffffff854);
  local_460 = *(undefined8 *)(in_RDI + 0x48);
  other_41.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_41.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_41
             ,in_stack_fffffffffffff854);
  local_470 = *(undefined8 *)(in_RDI + 0x50);
  other_42.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_42.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_42
             ,in_stack_fffffffffffff854);
  local_440.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_43.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_43.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_43
             ,in_stack_fffffffffffff854);
  local_480 = *(undefined8 *)(in_RDI + 0x48);
  other_44.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_44.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_44
             ,in_stack_fffffffffffff854);
  local_420.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_45.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_45.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_45
             ,in_stack_fffffffffffff854);
  local_490 = (Impl *)local_18.super_ExprBase.impl_;
  other_46.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_46.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_46,
             in_stack_fffffffffffff854);
  local_4a0 = (Impl *)local_10.super_ExprBase.impl_;
  other_47.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_47.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_47,
             in_stack_fffffffffffff854);
  local_410.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (NumericExpr)in_stack_fffffffffffff870.impl_,
                  (NumericExpr)in_stack_fffffffffffff868.impl_);
  message = &local_408;
  other_48.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_48.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_48,
             in_stack_fffffffffffff854);
  this_01 = local_3f8;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (in_stack_fffffffffffff888,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[33],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff868.impl_,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (char (*) [33])in_stack_fffffffffffff858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::__cxx11::string::~string((string *)local_3f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
    testing::AssertionResult::failure_message((AssertionResult *)0x1309a5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880),
               (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20),
               (char *)in_stack_fffffffffffff870.impl_,
               (int)((ulong)in_stack_fffffffffffff868.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x130a02);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130a5a);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_4e8,"{}");
  arg0.data_ = (char *)(in_RDI + 0x10);
  local_518 = *(undefined8 *)(in_RDI + 0x48);
  other_49.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_49.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_49
             ,in_stack_fffffffffffff854);
  local_538 = *(undefined8 *)(in_RDI + 0x50);
  other_50.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_50.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_50
             ,in_stack_fffffffffffff854);
  local_548 = *(undefined8 *)(in_RDI + 0x48);
  other_51.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_51.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_51
             ,in_stack_fffffffffffff854);
  rhs.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffff864;
  rhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffff860;
  local_528.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 (in_stack_fffffffffffff858,in_stack_fffffffffffff854,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_,rhs);
  other_52.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_52.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_52
             ,in_stack_fffffffffffff854);
  local_558 = *(undefined8 *)(in_RDI + 0x50);
  other_53.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_53.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_53
             ,in_stack_fffffffffffff854);
  local_508.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (LogicalExpr)in_stack_fffffffffffff870.impl_,
                  (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_54.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_54.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffff858,other_54
             ,in_stack_fffffffffffff854);
  local_568 = (Impl *)local_18.super_ExprBase.impl_;
  other_55.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_55.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_55,
             in_stack_fffffffffffff854);
  local_578 = (Impl *)local_10.super_ExprBase.impl_;
  other_56.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_56.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_56,
             in_stack_fffffffffffff854);
  local_4f8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
                  (LogicalExpr)in_stack_fffffffffffff878.impl_,
                  (NumericExpr)in_stack_fffffffffffff870.impl_,
                  (NumericExpr)in_stack_fffffffffffff868.impl_);
  other_57.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffff864;
  other_57.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffff858,other_57,
             in_stack_fffffffffffff854);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
                  CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[30],std::__cxx11::string>
            ((char *)in_stack_fffffffffffff868.impl_,
             (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             (char (*) [30])in_stack_fffffffffffff858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  std::__cxx11::string::~string(local_4e0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_4c0);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff880));
    in_stack_fffffffffffff878.impl_ =
         (Impl *)testing::AssertionResult::failure_message((AssertionResult *)0x130d31);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff880),
               (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20),
               (char *)in_stack_fffffffffffff870.impl_,
               (int)((ulong)in_stack_fffffffffffff868.impl_ >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x130d8e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130de6);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_5c0,"{}");
  this_00 = (BasicExprFactory<std::allocator<char>_> *)(in_RDI + 0x10);
  uVar4 = 0;
  other_58.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ = 0;
  other_58.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_00,other_58,
             in_stack_fffffffffffff854);
  other_59.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       uVar4;
  other_59.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_00,other_59,
             in_stack_fffffffffffff854);
  other_60.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       uVar4;
  other_60.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_00,other_60,
             in_stack_fffffffffffff854);
  rhs_00.super_ExprBase.impl_._4_4_ = uVar4;
  rhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffff860;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
            (this_00,in_stack_fffffffffffff854,(LogicalExpr)in_stack_fffffffffffff868.impl_,rhs_00);
  other_61.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._4_4_ =
       uVar4;
  other_61.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_00,other_61,
             in_stack_fffffffffffff854);
  other_62.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._4_4_ =
       uVar4;
  other_62.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_00,other_62,
             in_stack_fffffffffffff854);
  mp::BasicExprFactory<std::allocator<char>_>::MakeImplication
            ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(uVar4,in_stack_fffffffffffff860),
             (LogicalExpr)in_stack_fffffffffffff878.impl_,
             (LogicalExpr)in_stack_fffffffffffff870.impl_,
             (LogicalExpr)in_stack_fffffffffffff868.impl_);
  other_63.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._4_4_ =
       uVar4;
  other_63.super_BasicExpr<(mp::expr::Kind)65,_(mp::expr::Kind)65>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)65>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)this_00,other_63,
             in_stack_fffffffffffff854);
  other_64.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ = uVar4;
  other_64.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_00,other_64,
             in_stack_fffffffffffff854);
  other_65.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ = uVar4;
  other_65.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_00,other_65,
             in_stack_fffffffffffff854);
  mp::BasicExprFactory<std::allocator<char>_>::MakeIf
            ((BasicExprFactory<std::allocator<char>_> *)CONCAT44(uVar4,in_stack_fffffffffffff860),
             (LogicalExpr)in_stack_fffffffffffff878.impl_,
             (NumericExpr)in_stack_fffffffffffff870.impl_,
             (NumericExpr)in_stack_fffffffffffff868.impl_);
  type = (Type)((ulong)in_stack_fffffffffffff878.impl_ >> 0x20);
  expected_expression = local_5c8;
  other_66.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._4_4_ =
       uVar4;
  other_66.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffff860;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_00,other_66,
             in_stack_fffffffffffff854);
  file = local_5b8;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
                  CONCAT17(uVar2,in_stack_fffffffffffff880));
  testing::internal::EqHelper<false>::Compare<char[34],std::__cxx11::string>
            (expected_expression,(char *)CONCAT44(uVar4,in_stack_fffffffffffff860),
             (char (*) [34])this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850));
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff854);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar2,in_stack_fffffffffffff880));
    testing::AssertionResult::failure_message((AssertionResult *)0x1310bd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff880),type,(char *)file,line,
               (char *)CONCAT44(uVar4,in_stack_fffffffffffff860));
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar3,in_stack_fffffffffffff850));
    testing::Message::~Message((Message *)0x131118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13116d);
  return;
}

Assistant:

TEST_F(ExprWriterTest, ImplicationExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 ==> 1 ==> 0 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 ==> 0 else 1 then 1",
      MakeIf(MakeImplication(MakeImplication(l0, l1, l0), l0, l1), n1, n0));
  CHECK_WRITE("if 0 ==> 1 else 0 ==> 1 then 1",
      MakeIf(MakeImplication(l0, l1, MakeImplication(l0, l1, l0)), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0) else 1 then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 ==> 0 else 1) then 1",
      MakeIf(MakeImplication(l0, MakeImplication(l1, l0, l1), l0), n1, n0));
  CHECK_WRITE("if 0 ==> 1 || 0 else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::OR, l1, l0), l1), n1, n0));
  CHECK_WRITE("if 0 ==> (1 <==> 0) else 1 then 1",
              MakeIf(MakeImplication(
                       l0, MakeBinaryLogical(ex::IFF, l1, l0), l1), n1, n0));
}